

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O0

vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_> *
ctemplate::GetDefaultModifierForHtml(void)

{
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  *in_RDI;
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  *modvals;
  
  std::
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  ::vector(in_RDI);
  std::
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  ::push_back(in_RDI,(value_type *)(g_am_dirs + 8));
  return in_RDI;
}

Assistant:

vector<const ModifierAndValue*> GetDefaultModifierForHtml() {
  vector<const ModifierAndValue*> modvals;
  modvals.push_back(g_am_dirs[AM_HTML]);
  return modvals;
}